

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O3

void llvm::format_provider<llvm::StringLiteral,_void>::format
               (StringLiteral *V,raw_ostream *Stream,StringRef Style)

{
  ulong uVar1;
  bool bVar2;
  unsigned_long_long *in_R8;
  StringRef Str;
  StringRef Str_00;
  ulong local_20;
  unsigned_long_long ULLVal;
  
  if ((char *)Style.Length == (char *)0x0) {
    local_20 = 0xffffffffffffffff;
  }
  else {
    Str.Length = 10;
    Str.Data = (char *)Style.Length;
    bVar2 = getAsUnsignedInteger((llvm *)Style.Data,Str,(uint)&local_20,in_R8);
    if (bVar2) {
      __assert_fail("false && \"Style is not a valid integer\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/Support/FormatProviders.h"
                    ,0xcd,
                    "static void llvm::format_provider<llvm::StringLiteral>::format(const T &, llvm::raw_ostream &, StringRef) [T = llvm::StringLiteral, Enable = void]"
                   );
    }
  }
  uVar1 = (V->super_StringRef).Length;
  if (uVar1 < local_20) {
    local_20 = uVar1;
  }
  Str_00.Length = local_20;
  Str_00.Data = (V->super_StringRef).Data;
  raw_ostream::operator<<(Stream,Str_00);
  return;
}

Assistant:

static void format(const T &V, llvm::raw_ostream &Stream, StringRef Style) {
    size_t N = StringRef::npos;
    if (!Style.empty() && Style.getAsInteger(10, N)) {
      assert(false && "Style is not a valid integer");
    }
    llvm::StringRef S = V;
    Stream << S.substr(0, N);
  }